

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_color.h
# Opt level: O0

void crnlib::color::YCC_to_RGB(color_quad_u8 *rgb,color_quad_u8 *ycc,int cb_bias,int cr_bias)

{
  uint8 uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int cr;
  int cb;
  int y;
  int cr_bias_local;
  int cb_bias_local;
  color_quad_u8 *ycc_local;
  color_quad_u8 *rgb_local;
  
  uVar2 = (uint)(ycc->field_0).field_0.a;
  iVar3 = (uint)(ycc->field_0).field_0.r - cb_bias;
  iVar4 = (uint)(ycc->field_0).field_0.g - cr_bias;
  uVar1 = clamp_component(uVar2 + (iVar4 * 0x166e9 + 0x8000 >> 0x10));
  (rgb->field_0).field_0.r = uVar1;
  uVar1 = clamp_component(uVar2 + (iVar4 * -0xb6d2 + iVar3 * -0x581a + 0x8000 >> 0x10));
  (rgb->field_0).field_0.g = uVar1;
  uVar1 = clamp_component(uVar2 + (iVar3 * 0x1c5a2 + 0x8000 >> 0x10));
  (rgb->field_0).field_0.b = uVar1;
  (rgb->field_0).field_0.a = 0xff;
  return;
}

Assistant:

inline void YCC_to_RGB(color_quad_u8& rgb, const color_quad_u8& ycc, int cb_bias = 123, int cr_bias = 125)
        {
            const int y = ycc.a;
            const int cb = ycc.r - cb_bias;
            const int cr = ycc.g - cr_bias;
            rgb.r = clamp_component(y + ((R_CR * cr + 32768) >> 16));
            rgb.g = clamp_component(y + ((G_CR * cr + G_CB * cb + 32768) >> 16));
            rgb.b = clamp_component(y + ((B_CB * cb + 32768) >> 16));
            rgb.a = 255;
        }